

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall Network::printLastResult(Network *this)

{
  ostream *poVar1;
  ulong local_18;
  size_t i;
  Network *this_local;
  
  for (local_18 = 0; local_18 < this->layers[this->layerCount - 1]->nodeCount;
      local_18 = local_18 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Prediction: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,this->layers[this->layerCount - 1]->neurons[local_18]);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Network::printLastResult() {
	for (size_t i = 0; i < layers[layerCount - 1]->nodeCount; i++) {
		std::cout << "Prediction: " << layers[layerCount - 1]->neurons[i] << std::endl;
	}
}